

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

LibraryIncDirClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::LibraryIncDirClauseSyntax,slang::syntax::LibraryIncDirClauseSyntax_const&>
          (BumpAllocator *this,LibraryIncDirClauseSyntax *args)

{
  LibraryIncDirClauseSyntax *pLVar1;
  LibraryIncDirClauseSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pLVar1 = (LibraryIncDirClauseSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::LibraryIncDirClauseSyntax::LibraryIncDirClauseSyntax(in_RSI,pLVar1);
  return pLVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }